

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O2

vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
* FixedDegreeNetwork::generate_block_links
            (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *__return_storage_ptr__,uint degree,uint blocks)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  allocator_type local_65;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  uVar1 = (ulong)(degree + 1);
  local_60 = blocks;
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__,(ulong)((degree + 1) * blocks),&local_65);
  local_64 = 1;
  local_40 = uVar1;
  for (local_48 = 0; (uint)local_48 != local_60; local_48 = (ulong)((int)local_48 + 1)) {
    local_58 = (uint)local_48 * (int)uVar1;
    local_38 = 0;
    local_54 = 1;
    local_5c = local_64;
    while (local_38 != uVar1) {
      lVar2 = uVar1 - local_54;
      uVar3 = (int)local_38 + local_58;
      uVar4 = local_64;
      local_38 = local_38 + 1;
      while (bVar5 = lVar2 != 0, lVar2 = lVar2 + -1, bVar5) {
        local_4c = uVar4;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>
                  (&(__return_storage_ptr__->
                    super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t,&local_4c);
        local_50 = uVar3;
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::_M_insert_unique<unsigned_int>
                  (&(__return_storage_ptr__->
                    super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t,&local_50);
        uVar4 = uVar4 + 1;
      }
      local_54 = local_54 + 1;
      local_64 = local_64 + 1;
      uVar1 = local_40;
    }
    local_64 = local_5c + (int)uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::set<unsigned int> > generate_block_links(unsigned int degree,
                                                                     unsigned int blocks) {
        unsigned int nodes_per_block = degree + 1;
        std::vector<std::set<unsigned int> > links(nodes_per_block*blocks);

        for (unsigned int block_i = 0; block_i < blocks; block_i++)
            for (unsigned int node_i = 0; node_i < nodes_per_block; node_i++)
                for (unsigned int node_j = node_i + 1; node_j < nodes_per_block; node_j++) {
                    links[node_i + nodes_per_block*block_i].insert(node_j + nodes_per_block*block_i);
                    links[node_j + nodes_per_block*block_i].insert(node_i + nodes_per_block*block_i);
                }
        return links;
    }